

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O1

int run_test_condvar_1(void)

{
  long *plVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long *plVar5;
  long *plVar6;
  undefined8 *puVar7;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t thread;
  worker_config_conflict wc;
  undefined8 uStack_128;
  long *plStack_120;
  int aiStack_100 [2];
  long lStack_f8;
  worker_config_conflict *pwStack_f0;
  int local_d8 [2];
  long local_d0;
  undefined1 local_c8 [8];
  worker_config_conflict local_c0;
  
  worker_config_init(&local_c0,0,condvar_signal,condvar_wait);
  iVar2 = uv_thread_create(local_c8,worker,&local_c0);
  local_d0 = (long)iVar2;
  local_d8[0] = 0;
  local_d8[1] = 0;
  if (local_d0 == 0) {
    iVar2 = (*local_c0.wait_cond)(&local_c0,&local_c0.posted_1);
    local_d0 = (long)iVar2;
    local_d8[0] = 0;
    local_d8[1] = 0;
    if (local_d0 == 0) {
      (*local_c0.signal_cond)(&local_c0,&local_c0.posted_2);
      iVar2 = uv_thread_join(local_c8);
      local_d0 = (long)iVar2;
      local_d8[0] = 0;
      local_d8[1] = 0;
      if (local_d0 == 0) {
        worker_config_destroy(&local_c0);
        return 0;
      }
      goto LAB_001839a2;
    }
  }
  else {
    run_test_condvar_1_cold_1();
  }
  run_test_condvar_1_cold_2();
LAB_001839a2:
  piVar3 = local_d8;
  plVar5 = &local_d0;
  run_test_condvar_1_cold_3();
  piVar4 = aiStack_100;
  pwStack_f0 = &local_c0;
  uv_sem_wait();
  uv_mutex_lock(plVar5 + 8);
  lStack_f8 = (long)*piVar3;
  aiStack_100[0] = 0;
  aiStack_100[1] = 0;
  if (lStack_f8 == 0) {
    *piVar3 = 1;
    if ((int)plVar5[0x13] == 0) {
      uv_cond_signal(plVar5 + 0xd);
    }
    else {
      uv_cond_broadcast();
    }
    uv_mutex_unlock(plVar5 + 8);
    iVar2 = uv_sem_post(plVar5 + 4);
    return iVar2;
  }
  plVar6 = &lStack_f8;
  condvar_signal_cold_1();
  plVar1 = plVar6 + 8;
  plStack_120 = plVar5;
  uv_mutex_lock(plVar1);
  uv_sem_post(plVar6);
  do {
    uv_cond_wait(plVar6 + 0xd,plVar1);
  } while (*piVar4 == 0);
  uStack_128 = 1;
  if (*piVar4 == 1) {
    uv_mutex_unlock(plVar1);
    uv_sem_wait(plVar6 + 4);
    return 0;
  }
  puVar7 = &uStack_128;
  condvar_wait_cold_1();
  (*(code *)puVar7[0x15])();
  iVar2 = (*(code *)puVar7[0x16])(puVar7,puVar7 + 0x14);
  return iVar2;
}

Assistant:

TEST_IMPL(condvar_1) {
  worker_config wc;
  uv_thread_t thread;

  /* Helper signal-then-wait. */
  worker_config_init(&wc, 0, condvar_signal, condvar_wait);
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  /* We wait-then-signal. */
  ASSERT_OK(wc.wait_cond(&wc, &wc.posted_1));
  wc.signal_cond(&wc, &wc.posted_2);

  ASSERT_OK(uv_thread_join(&thread));
  worker_config_destroy(&wc);

  return 0;
}